

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void small_suite::test_minus_one(void)

{
  undefined4 local_58;
  value local_54 [2];
  undefined4 local_4c;
  type local_46 [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [1];
  
  decoder.current.view._M_str._7_1_ = 0xff;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>
            ((decoder *)local_38,(uchar (*) [1])((long)&decoder.current.view._M_str + 7));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xa0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x7c,"void small_suite::test_minus_one()",local_40,&local_44);
  local_46[0] = trial::protocol::bintoken::detail::decoder::
                value<trial::protocol::bintoken::token::int8>((decoder *)local_38);
  local_4c = 0xffffffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,int>
            ("decoder.value<token::int8>()","-1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x7d,"void small_suite::test_minus_one()",local_46,&local_4c);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_54[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_58 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x7f,"void small_suite::test_minus_one()",local_54,&local_58);
  return;
}

Assistant:

void test_minus_one()
{
    const value_type input[] = { 0xFF };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int8>(), -1);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}